

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O1

Aig_Obj_t * Abc_NtkConstructAig_rec(Mfs_Man_t *p,Abc_Obj_t *pNode,Aig_Man_t *pMan)

{
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pObjOld;
  Aig_Obj_t *pAVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *p1;
  long lVar8;
  int iVar9;
  
  pVVar7 = p->vSupp;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar8];
      pAVar5 = Aig_ObjCreateCi(pMan);
      *(Aig_Obj_t **)((long)pvVar3 + 8) = pAVar5;
      *(Aig_Obj_t **)((long)pvVar3 + 0x40) = pAVar5;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vSupp;
    } while (lVar8 < pVVar7->nSize);
  }
  pAVar4 = pNode->pNtk;
  if ((pAVar4->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar4->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar9 = (int)uVar1;
    if ((pAVar4->vTravIds).nCap < iVar9) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pAVar4->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar4->vTravIds).nCap = iVar9;
    }
    if (-500 < iVar2) {
      memset((pAVar4->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar4->vTravIds).nSize = iVar9;
  }
  iVar2 = pAVar4->nTravIds;
  pAVar4->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pVVar7 = p->vNodes;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        pObjOld = (Abc_Obj_t *)pVVar7->pArray[lVar8];
        Abc_MfsConvertHopToAig(pObjOld,pMan);
        if (pObjOld == pNode) {
          *(byte *)&pObjOld->pNext = *(byte *)&pObjOld->pNext ^ 1;
        }
        lVar8 = lVar8 + 1;
        pVVar7 = p->vNodes;
      } while (lVar8 < pVVar7->nSize);
    }
    pAVar5 = (Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1);
    pVVar7 = p->vRoots;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        p1 = Aig_Exor(pMan,*(Aig_Obj_t **)((long)pVVar7->pArray[lVar8] + 0x40),
                      *(Aig_Obj_t **)((long)pVVar7->pArray[lVar8] + 8));
        pAVar5 = Aig_Or(pMan,pAVar5,p1);
        lVar8 = lVar8 + 1;
        pVVar7 = p->vRoots;
      } while (lVar8 < pVVar7->nSize);
    }
    return pAVar5;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Aig_Obj_t * Abc_NtkConstructAig_rec( Mfs_Man_t * p, Abc_Obj_t * pNode, Aig_Man_t * pMan )
{
    Aig_Obj_t * pRoot, * pExor;
    Abc_Obj_t * pObj;
    int i;
    // assign AIG nodes to the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pObj, i )
        pObj->pCopy = pObj->pNext = (Abc_Obj_t *)Aig_ObjCreateCi( pMan );
    // strash intermediate nodes
    Abc_NtkIncrementTravId( pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        Abc_MfsConvertHopToAig( pObj, pMan );
        if ( pObj == pNode )
            pObj->pNext = Abc_ObjNot(pObj->pNext);
    }
    // create the observability condition
    pRoot = Aig_ManConst0(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        pExor = Aig_Exor( pMan, (Aig_Obj_t *)pObj->pCopy, (Aig_Obj_t *)pObj->pNext );
        pRoot = Aig_Or( pMan, pRoot, pExor );
    }
    return pRoot;
}